

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

ushort __thiscall QLocale::toUShort(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  ushort uVar2;
  ulong uVar3;
  QSimpleParsedNumber<unsigned_long_long> QVar5;
  ulong uVar4;
  
  pQVar1 = (this->d).d.ptr;
  QVar5 = QLocaleData::stringToUnsLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  uVar3 = QVar5.result;
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar5.used;
  }
  uVar4 = 0;
  if (uVar3 < 0x10000) {
    uVar4 = uVar3;
  }
  uVar2 = (ushort)uVar4;
  if (uVar3 >= 0x10000 && ok != (bool *)0x0) {
    *ok = false;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

ushort QLocale::toUShort(QStringView s, bool *ok) const
{
    return toIntegral_helper<ushort>(d, s, ok);
}